

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O1

void print_phone_list(acmod_id_t *p,uint32 n_p,char *btw,acmod_set_t *acmod_set)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char fmt [16];
  char local_48 [24];
  
  if (n_p == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    uVar5 = 0;
    do {
      pcVar2 = acmod_set_id2name(acmod_set,p[uVar8]);
      sVar3 = strlen(pcVar2);
      uVar6 = sVar3 & 0xffffffff;
      if ((uint)sVar3 < uVar5) {
        uVar6 = (ulong)uVar5;
      }
      uVar8 = uVar8 + 1;
      uVar5 = (uint)uVar6;
    } while (n_p != uVar8);
  }
  sprintf(local_48,"%%%ds%%s",uVar6);
  if (n_p != 0) {
    uVar8 = 0;
    do {
      uVar4 = (uint)uVar8;
      uVar1 = (int)(0x50 / uVar6) + uVar4;
      uVar5 = n_p;
      if (uVar1 < n_p) {
        uVar5 = uVar1;
      }
      uVar7 = uVar8;
      if (uVar4 < uVar5) {
        do {
          pcVar2 = " ";
          if (btw[uVar7] != '\0') {
            pcVar2 = "+";
          }
          printf(local_48,"",pcVar2);
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar5);
      }
      putchar(10);
      if (uVar4 < uVar5) {
        do {
          pcVar2 = acmod_set_id2name(acmod_set,p[uVar8]);
          printf(local_48,pcVar2," ");
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
      }
      putchar(10);
      putchar(10);
      uVar8 = (ulong)uVar1;
    } while (uVar1 < n_p);
  }
  return;
}

Assistant:

void
print_phone_list(acmod_id_t *p,
		 uint32 n_p,
		 char *btw,
		 acmod_set_t *acmod_set)
{
    uint32 i, j, k;
    uint32 mpl, l;
    char fmt[16];
    uint32 ppl;

    for (i = 0, mpl = 0; i < n_p; i++) {
	l = strlen(acmod_set_id2name(acmod_set, p[i]));
	if (l > mpl) mpl = l;
    }

    sprintf(fmt, "%%%ds%%s", mpl);

    ppl = 80 / mpl;

    /* print out the phone sequence in rows of at most PPL phones */
    for (i = 0; i < n_p; i += ppl) {
	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, "", (btw[j] ? "+" : " "));
	}
	printf("\n");

	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, acmod_set_id2name(acmod_set, p[j]), " ");
	}
	printf("\n");
	printf("\n");
    }
}